

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

void __thiscall
llvm::DWARFContext::addLocalsForDie
          (DWARFContext *this,DWARFCompileUnit *CU,DWARFDie Subprogram,DWARFDie Die,
          vector<llvm::DILocal,_std::allocator<llvm::DILocal>_> *Result)

{
  uint64_t FileIndex;
  DWARFDie Type_00;
  DWARFUnit *pDVar1;
  bool bVar2;
  byte bVar3;
  Tag TVar4;
  ArrayRef<unsigned_char> *pAVar5;
  uchar *puVar6;
  iterator end;
  char **ppcVar7;
  DWARFContext *this_00;
  LineTable *this_01;
  char *Str;
  DWARFFormValue *pDVar8;
  unsigned_long *puVar9;
  DWARFDie *pDVar10;
  DWARFDie DVar11;
  Optional<const_char_*> OVar12;
  Optional<unsigned_long> OVar13;
  DWARFDie Child;
  iterator __end1;
  iterator __begin1;
  DWARFDie *__range1;
  DWARFDie Origin_1;
  undefined1 local_2f0 [8];
  Optional<llvm::DWARFFormValue> DeclLineAttr;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_2a8;
  undefined1 local_2a0;
  LineTable *local_298;
  LineTable *LT;
  Optional<llvm::DWARFFormValue> DeclFileAttr;
  undefined7 uStack_237;
  undefined1 auStack_230 [8];
  DWARFDie Type;
  Optional<const_char_*> Name_1;
  Optional<llvm::DWARFFormValue> NameAttr_1;
  DWARFDie Origin;
  undefined7 uStack_1bf;
  undefined1 local_1b8 [8];
  Optional<llvm::DWARFFormValue> TagOffsetAttr;
  undefined1 local_178 [8];
  Optional<llvm::ArrayRef<unsigned_char>_> Location;
  Optional<llvm::DWARFFormValue> LocationAttr;
  Optional<const_char_*> Name;
  undefined1 local_108 [8];
  Optional<llvm::DWARFFormValue> NameAttr;
  DILocal Local;
  DWARFCompileUnit *CU_local;
  DWARFContext *this_local;
  DWARFDie Die_local;
  DWARFDie Subprogram_local;
  
  Subprogram_local.U = (DWARFUnit *)Subprogram.Die;
  Die_local.Die = (DWARFDebugInfoEntry *)Subprogram.U;
  Die_local.U = (DWARFUnit *)Die.Die;
  this_local = (DWARFContext *)Die.U;
  Local.TagOffset.Storage._8_8_ = CU;
  TVar4 = DWARFDie::getTag((DWARFDie *)&this_local);
  if ((TVar4 == DW_TAG_variable) ||
     (TVar4 = DWARFDie::getTag((DWARFDie *)&this_local), TVar4 == DW_TAG_formal_parameter)) {
    DILocal::DILocal((DILocal *)&NameAttr.Storage.hasVal);
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_108,(DWARFDie *)&Die_local.Die,DW_AT_name
                  );
    bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)local_108);
    if (bVar2) {
      pDVar8 = Optional<llvm::DWARFFormValue>::operator->
                         ((Optional<llvm::DWARFFormValue> *)local_108);
      OVar12 = DWARFFormValue::getAsCString(pDVar8);
      LocationAttr.Storage._48_8_ = OVar12.Storage.field_0;
      bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&LocationAttr.Storage.hasVal);
      if (bVar2) {
        ppcVar7 = Optional<const_char_*>::operator*
                            ((Optional<const_char_*> *)&LocationAttr.Storage.hasVal);
        std::__cxx11::string::operator=((string *)&NameAttr.Storage.hasVal,*ppcVar7);
      }
    }
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)&Location.Storage.hasVal,
                   (DWARFDie *)&this_local,DW_AT_location);
    bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&Location.Storage.hasVal);
    if (bVar2) {
      pDVar8 = Optional<llvm::DWARFFormValue>::operator->
                         ((Optional<llvm::DWARFFormValue> *)&Location.Storage.hasVal);
      DWARFFormValue::getAsBlock((Optional<llvm::ArrayRef<unsigned_char>_> *)local_178,pDVar8);
      bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)local_178);
      if (bVar2) {
        pAVar5 = Optional<llvm::ArrayRef<unsigned_char>_>::operator->
                           ((Optional<llvm::ArrayRef<unsigned_char>_> *)local_178);
        bVar2 = ArrayRef<unsigned_char>::empty(pAVar5);
        if (!bVar2) {
          pAVar5 = Optional<llvm::ArrayRef<unsigned_char>_>::operator*
                             ((Optional<llvm::ArrayRef<unsigned_char>_> *)local_178);
          puVar6 = ArrayRef<unsigned_char>::operator[](pAVar5,0);
          if (*puVar6 == 0x91) {
            pAVar5 = Optional<llvm::ArrayRef<unsigned_char>_>::operator->
                               ((Optional<llvm::ArrayRef<unsigned_char>_> *)local_178);
            puVar6 = ArrayRef<unsigned_char>::data(pAVar5);
            pAVar5 = Optional<llvm::ArrayRef<unsigned_char>_>::operator->
                               ((Optional<llvm::ArrayRef<unsigned_char>_> *)local_178);
            end = ArrayRef<unsigned_char>::end(pAVar5);
            TagOffsetAttr.Storage._48_8_ = decodeSLEB128(puVar6 + 1,(uint *)0x0,end,(char **)0x0);
            Optional<long>::operator=
                      ((Optional<long> *)&Local.DeclLine,(long *)&TagOffsetAttr.Storage.hasVal);
          }
        }
      }
    }
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_1b8,(DWARFDie *)&this_local,
                   DW_AT_LLVM_tag_offset);
    bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)local_1b8);
    if (bVar2) {
      pDVar8 = Optional<llvm::DWARFFormValue>::operator->
                         ((Optional<llvm::DWARFFormValue> *)local_1b8);
      OVar13 = DWARFFormValue::getAsUnsignedConstant(pDVar8);
      Local.Size.Storage._8_8_ = OVar13.Storage.field_0;
      Local.TagOffset.Storage.field_0.value._1_7_ = uStack_1bf;
      Local.TagOffset.Storage.field_0.empty = OVar13.Storage.hasVal;
    }
    DVar11 = DWARFDie::getAttributeValueAsReferencedDie
                       ((DWARFDie *)&this_local,DW_AT_abstract_origin);
    NameAttr_1.Storage._48_8_ = DVar11.U;
    bVar2 = DWARFDie::operator_cast_to_bool((DWARFDie *)&NameAttr_1.Storage.hasVal);
    if (bVar2) {
      this_local = (DWARFContext *)NameAttr_1.Storage._48_8_;
      Die_local.U = (DWARFUnit *)DVar11.Die;
    }
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)&Name_1.Storage.hasVal,(DWARFDie *)&this_local,
                   DW_AT_name);
    bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&Name_1.Storage.hasVal);
    if (bVar2) {
      pDVar8 = Optional<llvm::DWARFFormValue>::operator->
                         ((Optional<llvm::DWARFFormValue> *)&Name_1.Storage.hasVal);
      OVar12 = DWARFFormValue::getAsCString(pDVar8);
      Type.Die = (DWARFDebugInfoEntry *)OVar12.Storage.field_0;
      Name_1.Storage.field_0.empty = OVar12.Storage.hasVal;
      bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&Type.Die);
      if (bVar2) {
        ppcVar7 = Optional<const_char_*>::operator*((Optional<const_char_*> *)&Type.Die);
        std::__cxx11::string::operator=
                  ((string *)(Local.FunctionName.field_2._M_local_buf + 8),*ppcVar7);
      }
    }
    DVar11 = DWARFDie::getAttributeValueAsReferencedDie((DWARFDie *)&this_local,DW_AT_type);
    Type.U = (DWARFUnit *)DVar11.Die;
    auStack_230 = (undefined1  [8])DVar11.U;
    bVar2 = DWARFDie::operator_cast_to_bool((DWARFDie *)auStack_230);
    pDVar1 = Type.U;
    if (bVar2) {
      DeclFileAttr.Storage._48_8_ = auStack_230;
      bVar3 = getCUAddrSize(this);
      Type_00.Die = (DWARFDebugInfoEntry *)pDVar1;
      Type_00.U = (DWARFUnit *)DeclFileAttr.Storage._48_8_;
      OVar13 = getTypeSize(Type_00,(ulong)bVar3);
      Local.FrameOffset.Storage._8_8_ = OVar13.Storage.field_0;
      Local.Size.Storage.field_0.value._1_7_ = uStack_237;
      Local.Size.Storage.field_0.empty = OVar13.Storage.hasVal;
    }
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)&LT,(DWARFDie *)&this_local,DW_AT_decl_file);
    bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&LT);
    if (bVar2) {
      this_00 = DWARFUnit::getContext((DWARFUnit *)Local.TagOffset.Storage._8_8_);
      this_01 = getLineTableForUnit(this_00,(DWARFUnit *)Local.TagOffset.Storage._8_8_);
      local_298 = this_01;
      if (this_01 != (LineTable *)0x0) {
        pDVar8 = Optional<llvm::DWARFFormValue>::operator->((Optional<llvm::DWARFFormValue> *)&LT);
        OVar13 = DWARFFormValue::getAsUnsignedConstant(pDVar8);
        local_2a8 = OVar13.Storage.field_0;
        local_2a0 = OVar13.Storage.hasVal;
        puVar9 = Optional<unsigned_long>::getValue((Optional<unsigned_long> *)&local_2a8);
        FileIndex = *puVar9;
        Str = DWARFUnit::getCompilationDir((DWARFUnit *)Local.TagOffset.Storage._8_8_);
        StringRef::StringRef((StringRef *)&DeclLineAttr.Storage.hasVal,Str);
        DWARFDebugLine::LineTable::getFileNameByIndex
                  (this_01,FileIndex,stack0xfffffffffffffd48,AbsoluteFilePath,
                   (string *)((long)&Local.Name.field_2 + 8));
      }
    }
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_2f0,(DWARFDie *)&this_local,
                   DW_AT_decl_line);
    bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)local_2f0);
    if (bVar2) {
      pDVar8 = Optional<llvm::DWARFFormValue>::operator->
                         ((Optional<llvm::DWARFFormValue> *)local_2f0);
      OVar13 = DWARFFormValue::getAsUnsignedConstant(pDVar8);
      Origin_1.Die = (DWARFDebugInfoEntry *)OVar13.Storage.field_0;
      puVar9 = Optional<unsigned_long>::getValue((Optional<unsigned_long> *)&Origin_1.Die);
      Local.DeclFile.field_2._8_8_ = *puVar9;
    }
    std::vector<llvm::DILocal,_std::allocator<llvm::DILocal>_>::push_back
              (Result,(value_type *)&NameAttr.Storage.hasVal);
    DILocal::~DILocal((DILocal *)&NameAttr.Storage.hasVal);
  }
  else {
    TVar4 = DWARFDie::getTag((DWARFDie *)&this_local);
    if (TVar4 == DW_TAG_inlined_subroutine) {
      ___range1 = DWARFDie::getAttributeValueAsReferencedDie
                            ((DWARFDie *)&this_local,DW_AT_abstract_origin);
      bVar2 = DWARFDie::operator_cast_to_bool((DWARFDie *)&__range1);
      if (bVar2) {
        Die_local.Die = (DWARFDebugInfoEntry *)__range1;
        Subprogram_local.U = Origin_1.U;
      }
    }
    join_0x00000010_0x00000000_ = (DWARFDie)DWARFDie::begin((DWARFDie *)&this_local);
    join_0x00000010_0x00000000_ = (DWARFDie)DWARFDie::end((DWARFDie *)&this_local);
    while (bVar2 = llvm::operator!=((iterator *)&__end1.Die.Die,(iterator *)&Child.Die), bVar2) {
      pDVar10 = DWARFDie::iterator::operator*((iterator *)&__end1.Die.Die);
      Child.U = (DWARFUnit *)pDVar10->Die;
      DVar11.Die = (DWARFDebugInfoEntry *)Subprogram_local.U;
      DVar11.U = (DWARFUnit *)Die_local.Die;
      addLocalsForDie(this,(DWARFCompileUnit *)Local.TagOffset.Storage._8_8_,DVar11,*pDVar10,Result)
      ;
      DWARFDie::iterator::operator++((iterator *)&__end1.Die.Die);
    }
  }
  return;
}

Assistant:

void DWARFContext::addLocalsForDie(DWARFCompileUnit *CU, DWARFDie Subprogram,
                                   DWARFDie Die, std::vector<DILocal> &Result) {
  if (Die.getTag() == DW_TAG_variable ||
      Die.getTag() == DW_TAG_formal_parameter) {
    DILocal Local;
    if (auto NameAttr = Subprogram.find(DW_AT_name))
      if (Optional<const char *> Name = NameAttr->getAsCString())
        Local.FunctionName = *Name;
    if (auto LocationAttr = Die.find(DW_AT_location))
      if (Optional<ArrayRef<uint8_t>> Location = LocationAttr->getAsBlock())
        if (!Location->empty() && (*Location)[0] == DW_OP_fbreg)
          Local.FrameOffset =
              decodeSLEB128(Location->data() + 1, nullptr, Location->end());
    if (auto TagOffsetAttr = Die.find(DW_AT_LLVM_tag_offset))
      Local.TagOffset = TagOffsetAttr->getAsUnsignedConstant();

    if (auto Origin =
            Die.getAttributeValueAsReferencedDie(DW_AT_abstract_origin))
      Die = Origin;
    if (auto NameAttr = Die.find(DW_AT_name))
      if (Optional<const char *> Name = NameAttr->getAsCString())
        Local.Name = *Name;
    if (auto Type = Die.getAttributeValueAsReferencedDie(DW_AT_type))
      Local.Size = getTypeSize(Type, getCUAddrSize());
    if (auto DeclFileAttr = Die.find(DW_AT_decl_file)) {
      if (const auto *LT = CU->getContext().getLineTableForUnit(CU))
        LT->getFileNameByIndex(
            DeclFileAttr->getAsUnsignedConstant().getValue(),
            CU->getCompilationDir(),
            DILineInfoSpecifier::FileLineInfoKind::AbsoluteFilePath,
            Local.DeclFile);
    }
    if (auto DeclLineAttr = Die.find(DW_AT_decl_line))
      Local.DeclLine = DeclLineAttr->getAsUnsignedConstant().getValue();

    Result.push_back(Local);
    return;
  }

  if (Die.getTag() == DW_TAG_inlined_subroutine)
    if (auto Origin =
            Die.getAttributeValueAsReferencedDie(DW_AT_abstract_origin))
      Subprogram = Origin;

  for (auto Child : Die)
    addLocalsForDie(CU, Subprogram, Child, Result);
}